

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O3

bool __thiscall InliningDecider::InlineIntoInliner(InliningDecider *this,FunctionBody *inliner)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  LocalFunctionId functionId;
  undefined4 *puVar6;
  DynamicProfileInfo *this_00;
  FunctionInfo *pFVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  char16_t *form;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  if (inliner == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x2d,"(inliner)","inliner");
    if (!bVar3) goto LAB_0055bdcf;
    *puVar6 = 0;
  }
  if (this->jitMode != FullJit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x2e,"(this->jitMode == ExecutionMode::FullJit)",
                       "this->jitMode == ExecutionMode::FullJit");
    if (!bVar3) goto LAB_0055bdcf;
    *puVar6 = 0;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
  pFVar7 = (inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar7 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0055bdcf;
    *puVar6 = 0;
    pFVar7 = (inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InlinePhase,uVar4,pFVar7->functionId);
  if (bVar3) {
    return false;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
  pFVar7 = (inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar7 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0055bdcf;
    *puVar6 = 0;
    pFVar7 = (inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,GlobOptPhase,uVar4,pFVar7->functionId);
  if (bVar3) {
    return false;
  }
  if ((inliner->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    pFVar1 = this->topFunc;
    pFVar7 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_0055bdcf;
      *puVar6 = 0;
      pFVar7 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar4,pFVar7->functionId);
    if (bVar3) {
      form = L"INLINING: Skip Inline: No dynamic profile info\tCaller: %s (%s)\n";
      goto LAB_0055bd42;
    }
  }
  else {
    if (inliner->profiledCallSiteCount == 0) {
      this_00 = Js::FunctionBody::GetAnyDynamicProfileInfo(inliner);
      bVar3 = Js::DynamicProfileInfo::HasLdFldCallSiteInfo(this_00);
      if (!bVar3) {
        if (DAT_015bc46a != '\x01') {
          return false;
        }
        uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
        functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar4,functionId);
        if (!bVar3) {
          return false;
        }
        form = L"INLINING: Skip Inline: Leaf function\tCaller: %s (%s)\n";
        goto LAB_0055bd42;
      }
    }
    Js::FunctionBody::GetAnyDynamicProfileInfo(inliner);
    bVar3 = Js::DynamicProfileInfo::HasCallSiteInfo(inliner);
    if (bVar3) {
      return true;
    }
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    pFVar1 = this->topFunc;
    pFVar7 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
LAB_0055bdcf:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
      pFVar7 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar4,pFVar7->functionId);
    if (bVar3) {
      form = L"INLINING: Skip Inline: No call site info\tCaller: %s (#%d)\n";
LAB_0055bd42:
      iVar5 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
      pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                         ((FunctionProxy *)inliner,(wchar (*) [42])local_88);
      Output::Print(form,CONCAT44(extraout_var,iVar5),pcVar8);
      Output::Flush();
      return false;
    }
  }
  return false;
}

Assistant:

bool InliningDecider::InlineIntoInliner(Js::FunctionBody *const inliner) const
{
    Assert(inliner);
    Assert(this->jitMode == ExecutionMode::FullJit);

#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (PHASE_OFF(Js::InlinePhase, inliner) ||
        PHASE_OFF(Js::GlobOptPhase, inliner))
    {
        return false;
    }

    if (!inliner->HasDynamicProfileInfo())
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: No dynamic profile info\tCaller: %s (%s)\n"), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    if (inliner->GetProfiledCallSiteCount() == 0 && !inliner->GetAnyDynamicProfileInfo()->HasLdFldCallSiteInfo())
    {
        INLINE_TESTTRACE_VERBOSE(_u("INLINING: Skip Inline: Leaf function\tCaller: %s (%s)\n"), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer));
        // Nothing to do
        return false;
    }

    if (!inliner->GetAnyDynamicProfileInfo()->HasCallSiteInfo(inliner))
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: No call site info\tCaller: %s (#%d)\n"), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer));
        return false;
    }

    return true;
}